

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvDiurnal_kry.c
# Opt level: O2

int jtv(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector u,N_Vector fu,void *user_data,N_Vector tmp)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  
  lVar17 = N_VGetArrayPointer(u);
  lVar18 = N_VGetArrayPointer(v);
  lVar19 = N_VGetArrayPointer();
  dVar27 = sin(t * *(double *)((long)user_data + 0x968));
  dVar30 = 0.0;
  if (0.0 < dVar27) {
    dVar30 = exp(-7.601 / dVar27);
  }
  *(double *)((long)user_data + 0x960) = dVar30;
  dVar27 = *(double *)((long)user_data + 0x978);
  dVar4 = *(double *)((long)user_data + 0x990);
  dVar5 = *(double *)((long)user_data + 0x988);
  dVar6 = *(double *)((long)user_data + 0x980);
  lVar17 = lVar17 + 8;
  lVar26 = lVar18;
  for (lVar25 = 0; lVar25 != 10; lVar25 = lVar25 + 1) {
    dVar28 = ((double)(int)lVar25 + -0.5) * dVar27 + 30.0;
    dVar29 = exp(dVar28 * 0.2);
    dVar29 = dVar29 * dVar4;
    dVar28 = exp((dVar27 + dVar28) * 0.2);
    dVar28 = dVar28 * dVar4;
    lVar21 = 1;
    lVar20 = 0xffffffff;
    if (lVar25 == 0) {
      lVar20 = lVar21;
    }
    if (lVar25 == 9) {
      lVar21 = 0xffffffff;
    }
    lVar22 = lVar25 * 0xa0 + lVar18;
    iVar23 = 0;
    for (lVar24 = 0; lVar24 != 0xa0; lVar24 = lVar24 + 0x10) {
      dVar7 = *(double *)(lVar17 + -8 + lVar24);
      dVar8 = *(double *)(lVar17 + lVar24);
      dVar9 = *(double *)(lVar26 + lVar24);
      dVar10 = ((double *)(lVar26 + lVar24))[1];
      pdVar1 = (double *)(((lVar21 + lVar25) * 0x1400000000 >> 0x1d) + lVar18 + lVar24);
      dVar11 = pdVar1[1];
      pdVar2 = (double *)(((lVar20 + lVar25) * 0x1400000000 >> 0x1d) + lVar18 + lVar24);
      dVar12 = pdVar2[1];
      pdVar3 = (double *)(lVar22 + (long)(int)((iVar23 + (uint)(lVar24 != 0x90) * 2) * 2 + -2) * 8);
      dVar13 = *pdVar3;
      dVar14 = pdVar3[1];
      pdVar3 = (double *)(lVar22 + (long)(int)(((-(uint)(lVar24 != 0) | 1) + iVar23) * 2) * 8);
      dVar15 = *pdVar3;
      dVar16 = pdVar3[1];
      *(double *)(lVar19 + lVar24) =
           (dVar13 - dVar15) * dVar5 +
           ((dVar13 - (dVar9 + dVar9)) + dVar15) * dVar6 +
           -(dVar29 + dVar28) * dVar9 + *pdVar1 * dVar28 + *pdVar2 * dVar29 +
           dVar9 * -(dVar8 * 4.66e-16 + 6.031000000000001) + dVar10 * (dVar7 * -4.66e-16 + dVar30) +
           0.0;
      ((double *)(lVar19 + lVar24))[1] =
           (dVar14 - dVar16) * dVar5 +
           ((dVar14 - (dVar10 + dVar10)) + dVar16) * dVar6 +
           -(dVar29 + dVar28) * dVar10 + dVar11 * dVar28 + dVar12 * dVar29 +
           dVar9 * (dVar8 * -4.66e-16 + 6.031000000000001) + dVar10 * -(dVar7 * 4.66e-16 + dVar30) +
           0.0;
      iVar23 = iVar23 + 1;
    }
    lVar17 = lVar17 + 0xa0;
    lVar19 = lVar19 + 0xa0;
    lVar26 = lVar26 + 0xa0;
  }
  return 0;
}

Assistant:

static int jtv(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector u, N_Vector fu,
               void* user_data, N_Vector tmp)
{
  sunrealtype c1, c2;
  sunrealtype v1, v2, v1dn, v2dn, v1up, v2up, v1lt, v2lt, v1rt, v2rt;
  sunrealtype Jv1, Jv2;
  sunrealtype cydn, cyup;
  sunrealtype s, ydn, yup;
  sunrealtype q4coef, dely, verdco, hordco, horaco;
  int jx, jy, idn, iup, ileft, iright;
  sunrealtype *udata, *vdata, *Jvdata;
  UserData data;

  data = (UserData)user_data;

  udata  = N_VGetArrayPointer(u);
  vdata  = N_VGetArrayPointer(v);
  Jvdata = N_VGetArrayPointer(Jv);

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO) { data->q4 = exp(-A4 / s); }
  else { data->q4 = ZERO; }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  dely   = data->dy;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jy = 0; jy < MY; jy++)
  {
    /* Set vertical diffusion coefficients at jy +- 1/2 */

    ydn = YMIN + (jy - SUN_RCONST(0.5)) * dely;
    yup = ydn + dely;

    cydn = verdco * exp(SUN_RCONST(0.2) * ydn);
    cyup = verdco * exp(SUN_RCONST(0.2) * yup);

    idn = (jy == 0) ? 1 : -1;
    iup = (jy == MY - 1) ? -1 : 1;

    for (jx = 0; jx < MX; jx++)
    {
      Jv1 = ZERO;
      Jv2 = ZERO;

      /* Extract c1 and c2 at the current location and at neighbors */

      c1 = IJKth(udata, 1, jx, jy);
      c2 = IJKth(udata, 2, jx, jy);

      v1 = IJKth(vdata, 1, jx, jy);
      v2 = IJKth(vdata, 2, jx, jy);

      v1dn = IJKth(vdata, 1, jx, jy + idn);
      v2dn = IJKth(vdata, 2, jx, jy + idn);
      v1up = IJKth(vdata, 1, jx, jy + iup);
      v2up = IJKth(vdata, 2, jx, jy + iup);

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;

      v1lt = IJKth(vdata, 1, jx + ileft, jy);
      v2lt = IJKth(vdata, 2, jx + ileft, jy);
      v1rt = IJKth(vdata, 1, jx + iright, jy);
      v2rt = IJKth(vdata, 2, jx + iright, jy);

      /* Set kinetic rate terms. */

      /*
	 rkin1 = -Q1*C3 * c1 - Q2 * c1*c2 + q4coef * c2  + TWO*C3*q3;
         rkin2 =  Q1*C3 * c1 - Q2 * c1*c2 - q4coef * c2;
      */

      Jv1 += -(Q1 * C3 + Q2 * c2) * v1 + (q4coef - Q2 * c1) * v2;
      Jv2 += (Q1 * C3 - Q2 * c2) * v1 - (q4coef + Q2 * c1) * v2;

      /* Set vertical diffusion terms. */

      /*
	 vertd1 = -(cyup+cydn) * c1 + cyup * c1up + cydn * c1dn;
	 vertd2 = -(cyup+cydn) * c2 + cyup * c2up + cydn * c2dn;
      */

      Jv1 += -(cyup + cydn) * v1 + cyup * v1up + cydn * v1dn;
      Jv2 += -(cyup + cydn) * v2 + cyup * v2up + cydn * v2dn;

      /* Set horizontal diffusion and advection terms. */

      /*
	 hord1 = hordco*(c1rt - TWO*c1 + c1lt);
	 hord2 = hordco*(c2rt - TWO*c2 + c2lt);
      */

      Jv1 += hordco * (v1rt - TWO * v1 + v1lt);
      Jv2 += hordco * (v2rt - TWO * v2 + v2lt);

      /*
	 horad1 = horaco*(c1rt - c1lt);
	 horad2 = horaco*(c2rt - c2lt);
      */

      Jv1 += horaco * (v1rt - v1lt);
      Jv2 += horaco * (v2rt - v2lt);

      /* Load two components of J*v */

      /*
	 IJKth(dudata, 1, jx, jy) = vertd1 + hord1 + horad1 + rkin1;
	 IJKth(dudata, 2, jx, jy) = vertd2 + hord2 + horad2 + rkin2;
      */

      IJKth(Jvdata, 1, jx, jy) = Jv1;
      IJKth(Jvdata, 2, jx, jy) = Jv2;
    }
  }

  return (0);
}